

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O0

void __thiscall
MxxColl_GathervUnknownSize_Test::~MxxColl_GathervUnknownSize_Test
          (MxxColl_GathervUnknownSize_Test *this)

{
  MxxColl_GathervUnknownSize_Test *this_local;
  
  ~MxxColl_GathervUnknownSize_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MxxColl, GathervUnknownSize) {
    mxx::comm c;
    // fill elements
    size_t size = 5*(c.rank()+2);
    std::vector<int> els(size);
    for (size_t i = 0; i < size; ++i) {
        els[i] = c.rank()*13 - 42*i;
    }
    size_t total_size = 0;
    if (c.rank() == 0) {
        // prepare recv sizes and output vector
        for (int i = 0; i < c.size(); ++i) {
            total_size += 5*(i+2);
        }
    }

    // gatherv with unknown receive sizes
    std::vector<int> all;
    all = mxx::gatherv(&els[0], size, 0, c);
    if (c.rank() == 0) {
        ASSERT_EQ(total_size, all.size());
        size_t pos = 0;
        for (int i = 0; i < c.size(); ++i) {
            for (int j = 0; j < (5*(i+2)); ++j) {
                ASSERT_EQ(i*13 - 42*j, all[pos++]);
            }
        }
    } else {
        ASSERT_EQ(0u, all.size());
    }
    // convenience function (taking vector)
    all = mxx::gatherv(els, 0);
    if (c.rank() == 0) {
        ASSERT_EQ(total_size, all.size());
        size_t pos = 0;
        for (int i = 0; i < c.size(); ++i) {
            for (int j = 0; j < (5*(i+2)); ++j) {
                ASSERT_EQ(i*13 - 42*j, all[pos++]);
            }
        }
    } else {
        ASSERT_EQ(0u, all.size());
    }
}